

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O0

int Bmc_BmciPart_rec(Gia_Man_t *pNew,Vec_Int_t *vSatMap,int iIdNew,Gia_Man_t *pPart,
                    Vec_Int_t *vPartMap,Vec_Int_t *vCopies)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  int iRes;
  int iLitPart1;
  int iLitPart0;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCopies_local;
  Vec_Int_t *vPartMap_local;
  Gia_Man_t *pPart_local;
  int iIdNew_local;
  Vec_Int_t *vSatMap_local;
  Gia_Man_t *pNew_local;
  
  pObj_00 = Gia_ManObj(pNew,iIdNew);
  iVar1 = Vec_IntEntry(vCopies,iIdNew);
  if (iVar1 == 0) {
    iVar1 = Vec_IntEntry(vSatMap,iIdNew);
    if ((iVar1 < 0) && (iVar1 = Gia_ObjIsCi(pObj_00), iVar1 == 0)) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFaninId0(pObj_00,iIdNew);
        iVar1 = Bmc_BmciPart_rec(pNew,vSatMap,iVar1,pPart,vPartMap,vCopies);
        iVar2 = Gia_ObjFaninId1(pObj_00,iIdNew);
        iVar2 = Bmc_BmciPart_rec(pNew,vSatMap,iVar2,pPart,vPartMap,vCopies);
        iVar3 = Gia_ObjFaninC0(pObj_00);
        iVar1 = Abc_LitNotCond(iVar1,iVar3);
        iVar3 = Gia_ObjFaninC1(pObj_00);
        iVar2 = Abc_LitNotCond(iVar2,iVar3);
        Vec_IntPush(vPartMap,iIdNew);
        iVar1 = Gia_ManAppendAnd(pPart,iVar1,iVar2);
        Vec_IntWriteEntry(vCopies,iIdNew,iVar1);
        return iVar1;
      }
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                    ,0x83,
                    "int Bmc_BmciPart_rec(Gia_Man_t *, Vec_Int_t *, int, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Vec_IntPush(vPartMap,iIdNew);
    pNew_local._4_4_ = Gia_ManAppendCi(pPart);
    Vec_IntWriteEntry(vCopies,iIdNew,pNew_local._4_4_);
  }
  else {
    pNew_local._4_4_ = Vec_IntEntry(vCopies,iIdNew);
  }
  return pNew_local._4_4_;
}

Assistant:

int Bmc_BmciPart_rec( Gia_Man_t * pNew, Vec_Int_t * vSatMap, int iIdNew, Gia_Man_t * pPart, Vec_Int_t * vPartMap, Vec_Int_t * vCopies )
{
    Gia_Obj_t * pObj = Gia_ManObj( pNew, iIdNew ); 
    int iLitPart0, iLitPart1, iRes;
    if ( Vec_IntEntry(vCopies, iIdNew) )
        return Vec_IntEntry(vCopies, iIdNew);
    if ( Vec_IntEntry(vSatMap, iIdNew) >= 0 || Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPartMap, iIdNew );
        iRes = Gia_ManAppendCi(pPart);
        Vec_IntWriteEntry( vCopies, iIdNew, iRes );
        return iRes;
    }
    assert( Gia_ObjIsAnd(pObj) );
    iLitPart0 = Bmc_BmciPart_rec( pNew, vSatMap, Gia_ObjFaninId0(pObj, iIdNew), pPart, vPartMap, vCopies );
    iLitPart1 = Bmc_BmciPart_rec( pNew, vSatMap, Gia_ObjFaninId1(pObj, iIdNew), pPart, vPartMap, vCopies );
    iLitPart0 = Abc_LitNotCond( iLitPart0, Gia_ObjFaninC0(pObj) );
    iLitPart1 = Abc_LitNotCond( iLitPart1, Gia_ObjFaninC1(pObj) );
    Vec_IntPush( vPartMap, iIdNew );
    iRes = Gia_ManAppendAnd( pPart, iLitPart0, iLitPart1 );
    Vec_IntWriteEntry( vCopies, iIdNew, iRes );
    return iRes;
}